

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O0

bool tchecker::dbm::is_consistent(db_t *dbm,clock_id_t dim)

{
  bool bVar1;
  uint local_20;
  clock_id_t i;
  clock_id_t dim_local;
  db_t *dbm_local;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x53,
                  "bool tchecker::dbm::is_consistent(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
                 );
  }
  if (dim != 0) {
    local_20 = 0;
    while( true ) {
      if (dim <= local_20) {
        return true;
      }
      bVar1 = operator!=(dbm + (local_20 * dim + local_20),(db_t *)&LE_ZERO);
      if (bVar1) break;
      local_20 = local_20 + 1;
    }
    return false;
  }
  __assert_fail("dim >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x54,
                "bool tchecker::dbm::is_consistent(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

bool is_consistent(tchecker::dbm::db_t const * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    if (DBM(i, i) != tchecker::dbm::LE_ZERO)
      return false;
  return true;
}